

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::writeAssociativeContainer<QMap<QString,QVariant>>
          (QDataStream *s,QMap<QString,_QVariant> *c)

{
  long lVar1;
  bool bVar2;
  QString *pQVar3;
  QDataStream *pQVar4;
  QVariant *pQVar5;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  const_iterator end;
  const_iterator it;
  QDataStream *in_stack_ffffffffffffffa8;
  QMap<QString,_QVariant> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<QString,_QVariant>::size(in_stack_ffffffffffffffb0);
  bVar2 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x1321f1);
  if (bVar2) {
    QMap<QString,_QVariant>::constBegin((QMap<QString,_QVariant> *)in_stack_ffffffffffffffa8);
    QMap<QString,_QVariant>::constEnd((QMap<QString,_QVariant> *)in_stack_ffffffffffffffa8);
    while (bVar2 = operator!=((const_iterator *)in_stack_ffffffffffffffb0,
                              (const_iterator *)in_stack_ffffffffffffffa8), bVar2) {
      pQVar3 = QMap<QString,_QVariant>::const_iterator::key((const_iterator *)0x132263);
      pQVar4 = (QDataStream *)::operator<<(in_RDI,(QString *)pQVar3);
      pQVar5 = QMap<QString,_QVariant>::const_iterator::value((const_iterator *)0x13227f);
      ::operator<<(pQVar4,(QVariant *)pQVar5);
      QMap<QString,_QVariant>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffffb0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeAssociativeContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    auto it = c.constBegin();
    auto end = c.constEnd();
    while (it != end) {
        s << it.key() << it.value();
        ++it;
    }

    return s;
}